

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O2

void ge_add(ge_p1p1 *r,ge_p3 *p,ge_cached *q)

{
  i32 *h;
  i32 *h_00;
  i32 *h_01;
  fe t0;
  i32 aiStack_58 [10];
  
  fe_add(r->X,p->Y,p->X);
  h = r->Y;
  fe_sub(h,p->Y,p->X);
  h_00 = r->Z;
  fe_mul(h_00,r->X,q->YplusX);
  fe_mul(h,h,q->YminusX);
  h_01 = r->T;
  fe_mul(h_01,q->T2d,p->T);
  fe_mul(r->X,p->Z,q->Z);
  fe_add(aiStack_58,r->X,r->X);
  fe_sub(r->X,h_00,h);
  fe_add(h,h_00,h);
  fe_add(h_00,aiStack_58,h_01);
  fe_sub(h_01,aiStack_58,h_01);
  return;
}

Assistant:

void ge_add(ge_p1p1 *r, const ge_p3 *p, const ge_cached *q) {
    fe t0;
    fe_add(r->X, p->Y, p->X);
    fe_sub(r->Y, p->Y, p->X);
    fe_mul(r->Z, r->X, q->YplusX);
    fe_mul(r->Y, r->Y, q->YminusX);
    fe_mul(r->T, q->T2d, p->T);
    fe_mul(r->X, p->Z, q->Z);
    fe_add(t0, r->X, r->X);
    fe_sub(r->X, r->Z, r->Y);
    fe_add(r->Y, r->Z, r->Y);
    fe_add(r->Z, t0, r->T);
    fe_sub(r->T, t0, r->T);
}